

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t
spvtools::val::StructuredControlFlowChecks
          (ValidationState_t *_,Function *function,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *back_edges,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  Construct *this;
  _Base_bitset<1UL> *p_Var1;
  size_type *psVar2;
  ulong *puVar3;
  pointer ppVar4;
  pointer ppBVar5;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *plVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ConstructType CVar10;
  uint uVar11;
  spv_result_t sVar12;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar13;
  mapped_type *pmVar14;
  Instruction *pIVar15;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *plVar16;
  BasicBlock *pBVar17;
  BasicBlock *pBVar18;
  long *plVar19;
  const_iterator cVar20;
  undefined8 uVar21;
  pointer ppVar22;
  ConstructType type;
  ConstructType type_00;
  pointer ppBVar23;
  uint32_t merge_block_id;
  spv_result_t unaff_R14D;
  _Base_bitset<1UL> _Var24;
  bool bVar25;
  char cVar26;
  pair<spvtools::val::BasicBlock_*,_bool> pVar27;
  uint32_t loop_header_id;
  BasicBlock *pred;
  uint32_t header_block;
  uint32_t back_edge_block;
  ConstructBlockSet construct_blocks;
  BasicBlock *succ;
  BasicBlock *merge_block;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range6;
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  loop_latch_blocks;
  spv_result_t local_41c;
  undefined1 local_410 [32];
  undefined1 local_3f0 [32];
  undefined1 local_3d0 [32];
  BasicBlock *local_3b0;
  string local_3a8;
  undefined1 local_388 [8];
  bitset<7UL> local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [2];
  undefined1 local_358 [32];
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *local_338;
  _Base_bitset<1UL> local_330;
  Function *local_328;
  string local_320;
  Construct *local_300;
  _Base_bitset<1UL> local_2f8;
  pointer local_2f0;
  pointer local_2e8;
  BasicBlock *pBStack_2e0;
  BasicBlock *local_2d8;
  BasicBlock *local_2d0;
  string local_2c8;
  _Base_bitset<1UL> *local_2a8;
  pointer local_2a0;
  _Base_bitset<1UL> local_298;
  long lStack_290;
  Instruction *local_288;
  Instruction *local_280;
  undefined1 local_278 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [24];
  spv_result_t local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar22 = (back_edges->
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar25 = ppVar22 == ppVar4;
  local_328 = function;
  local_278._16_8_ = postorder;
  local_278._24_8_ = back_edges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_41c = unaff_R14D;
  if (!bVar25) {
    do {
      local_3a8._M_dataplus._M_p._0_4_ = (*ppVar22).first;
      merge_block_id = (*ppVar22).second;
      local_3d0._0_4_ = merge_block_id;
      bVar7 = Function::IsBlockType(local_328,merge_block_id,kBlockTypeLoop);
      if (bVar7) {
        local_238._0_8_ =
             std::
             map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           *)&local_60,(key_type_conflict *)local_3d0);
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_238._0_8_,&local_3a8,(DiagnosticStream *)local_238);
      }
      else {
        pIVar15 = ValidationState_t::FindDef(_,(uint)local_3a8._M_dataplus._M_p);
        ValidationState_t::diag((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Back-edges (",0xc);
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)local_388,_,(uint)local_3a8._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,(char *)local_388,
                   (long)local_380.super__Base_bitset<1UL>._M_w);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238," -> ",4);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_410,_,local_3d0._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,(char *)local_410._0_8_,local_410._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,") can only be formed between a block and a loop header.",
                   0x37);
        local_41c = local_68;
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
        }
        if (local_388 != (undefined1  [8])local_378) {
          operator_delete((void *)local_388,
                          CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                   local_378[0]._M_local_buf[0]) + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
      }
      if (!bVar7) break;
      ppVar22 = ppVar22 + 1;
      bVar25 = ppVar22 == ppVar4;
    } while (!bVar25);
  }
  if (bVar25) {
    pvVar13 = Function::ordered_blocks(local_328);
    ppBVar23 = (pvVar13->
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppBVar5 = (pvVar13->
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar25 = ppBVar23 == ppBVar5;
    if (!bVar25) {
      do {
        pBVar17 = *ppBVar23;
        iVar9 = 5;
        if ((pBVar17->structurally_reachable_ == true) &&
           (((pBVar17->type_).super__Base_bitset<1UL>._M_w & 4) != 0)) {
          local_410._0_4_ = pBVar17->id_;
          pmVar14 = std::
                    map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                  *)&local_60,(key_type_conflict *)local_410);
          iVar9 = 0;
          if ((pmVar14->_M_h)._M_element_count != 1) {
            pIVar15 = ValidationState_t::FindDef(_,local_410._0_4_);
            ValidationState_t::diag((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,"Loop header ",0xc);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_388,_,local_410._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,(char *)local_388,
                       (long)local_380.super__Base_bitset<1UL>._M_w);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238," is targeted by ",0x10);
            std::ostream::_M_insert<unsigned_long>((ulong)local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,
                       " back-edge blocks but the standard requires exactly one",0x37);
            local_41c = local_68;
            if (local_388 != (undefined1  [8])local_378) {
              operator_delete((void *)local_388,
                              CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                       local_378[0]._M_local_buf[0]) + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
            iVar9 = 1;
          }
        }
        if ((iVar9 != 5) && (iVar9 != 0)) break;
        ppBVar23 = ppBVar23 + 1;
        bVar25 = ppBVar23 == ppBVar5;
      } while (!bVar25);
    }
    if (bVar25) {
      plVar16 = Function::constructs_abi_cxx11_(local_328);
      _Var24._M_w = (_WordT)(plVar16->
                            super__List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
                            )._M_impl._M_node.super__List_node_base._M_next;
      plVar6 = plVar16;
      if ((list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *)_Var24._M_w
          == plVar16) {
        bVar25 = true;
      }
      else {
        do {
          local_338 = plVar6;
          this = (Construct *)(_Var24._M_w + 0x10);
          pBVar17 = Construct::entry_block(this);
          if (pBVar17->structurally_reachable_ == true) {
            pBVar18 = Construct::exit_block(this);
            if (pBVar18 == (BasicBlock *)0x0) {
              local_388 = (undefined1  [8])local_378;
              local_380.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
              local_378[0]._M_local_buf[0] = '\0';
              local_410._0_8_ = local_410 + 0x10;
              local_410._8_8_ = 0;
              local_410[0x10] = '\0';
              local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
              local_3a8._M_string_length = 0;
              local_3a8.field_2._M_local_buf[0] = '\0';
              CVar10 = Construct::type(this);
              ConstructNames_abi_cxx11_
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_238,(val *)(ulong)CVar10,type);
              local_3d0._0_8_ = &local_3a8;
              local_3d0._8_8_ = local_410;
              local_3d0._16_8_ = local_388;
              std::
              _Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
              _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                          *)local_3d0,
                         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_p != local_1e8) {
                operator_delete(local_1f8._M_p,local_1e8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_p != &local_208) {
                operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
              }
              if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)local_238._0_8_ !=
                  (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)(local_238 + 0x10)) {
                operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
              }
              pIVar15 = ValidationState_t::FindDef(_,pBVar17->id_);
              ValidationState_t::diag((DiagnosticStream *)local_238,_,SPV_ERROR_INTERNAL,pIVar15);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_278 + 0x20),"Construct ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
              plVar19 = (long *)std::__cxx11::string::append((char *)(local_278 + 0x20));
              local_288 = (Instruction *)local_278;
              pIVar15 = (Instruction *)(plVar19 + 2);
              if ((Instruction *)*plVar19 == pIVar15) {
                local_278._0_8_ =
                     (pIVar15->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_278._8_8_ = plVar19[3];
              }
              else {
                local_278._0_8_ =
                     (pIVar15->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_288 = (Instruction *)*plVar19;
              }
              local_280 = (Instruction *)plVar19[1];
              *plVar19 = (long)pIVar15;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_288,local_410._0_8_);
              plVar16 = local_338;
              p_Var1 = (_Base_bitset<1UL> *)(plVar19 + 2);
              if ((_Base_bitset<1UL> *)*plVar19 == p_Var1) {
                local_298._M_w = p_Var1->_M_w;
                lStack_290 = plVar19[3];
                local_2a8 = &local_298;
              }
              else {
                local_298._M_w = p_Var1->_M_w;
                local_2a8 = (_Base_bitset<1UL> *)*plVar19;
              }
              local_2a0 = (pointer)plVar19[1];
              *plVar19 = (long)p_Var1;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_2a8);
              pBVar18 = (BasicBlock *)(plVar19 + 2);
              if ((BasicBlock *)*plVar19 == pBVar18) {
                local_2e8 = *(pointer *)pBVar18;
                pBStack_2e0 = (BasicBlock *)plVar19[3];
                local_2f8._M_w = (_WordT)&local_2e8;
              }
              else {
                local_2e8 = *(pointer *)pBVar18;
                local_2f8._M_w = (_WordT)*plVar19;
              }
              local_2f0 = (pointer)plVar19[1];
              *plVar19 = (long)pBVar18;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              ValidationState_t::getIdName_abi_cxx11_(&local_2c8,_,pBVar17->id_);
              ppBVar23 = (pointer)0xf;
              if ((BasicBlock *)local_2f8._M_w != (BasicBlock *)&local_2e8) {
                ppBVar23 = local_2e8;
              }
              if (ppBVar23 < (pointer)(local_2c8._M_string_length + (long)local_2f0)) {
                uVar21 = (pointer)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  uVar21 = local_2c8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar21 < (pointer)(local_2c8._M_string_length + (long)local_2f0))
                goto LAB_001af807;
                plVar19 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_2c8,0,(char *)0x0,local_2f8._M_w);
              }
              else {
LAB_001af807:
                plVar19 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_2f8,(ulong)local_2c8._M_dataplus._M_p);
              }
              local_358._0_8_ = local_358 + 0x10;
              pBVar17 = (BasicBlock *)(plVar19 + 2);
              if ((BasicBlock *)*plVar19 == pBVar17) {
                local_358._16_8_ = *(undefined8 *)pBVar17;
                local_358._24_8_ = plVar19[3];
              }
              else {
                local_358._16_8_ = *(undefined8 *)pBVar17;
                local_358._0_8_ = (BasicBlock *)*plVar19;
              }
              local_358._8_8_ = plVar19[1];
              *plVar19 = (long)pBVar17;
              plVar19[1] = 0;
              *(undefined1 *)&pBVar17->id_ = 0;
              plVar19 = (long *)std::__cxx11::string::append(local_358);
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              psVar2 = (size_type *)(plVar19 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar19 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar2) {
                local_320.field_2._M_allocated_capacity = *psVar2;
                local_320.field_2._8_8_ = plVar19[3];
              }
              else {
                local_320.field_2._M_allocated_capacity = *psVar2;
                local_320._M_dataplus._M_p = (pointer)*plVar19;
              }
              local_320._M_string_length = plVar19[1];
              *plVar19 = (long)psVar2;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_320,(ulong)local_3a8._M_dataplus._M_p);
              pBVar17 = (BasicBlock *)(plVar19 + 2);
              if ((BasicBlock *)*plVar19 == pBVar17) {
                local_3f0._16_8_ = *(undefined8 *)pBVar17;
                local_3f0._24_8_ = plVar19[3];
                local_3f0._0_8_ = (BasicBlock *)(local_3f0 + 0x10);
              }
              else {
                local_3f0._16_8_ = *(undefined8 *)pBVar17;
                local_3f0._0_8_ = (BasicBlock *)*plVar19;
              }
              local_3f0._8_8_ = plVar19[1];
              *plVar19 = (long)pBVar17;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              plVar19 = (long *)std::__cxx11::string::append(local_3f0);
              puVar3 = (ulong *)(plVar19 + 2);
              if ((ulong *)*plVar19 == puVar3) {
                local_3d0._16_8_ = *puVar3;
                local_3d0._24_8_ = plVar19[3];
                local_3d0._0_8_ = local_3d0 + 0x10;
              }
              else {
                local_3d0._16_8_ = *puVar3;
                local_3d0._0_8_ = (ulong *)*plVar19;
              }
              local_3d0._8_8_ = plVar19[1];
              *plVar19 = (long)puVar3;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,(char *)local_3d0._0_8_,local_3d0._8_8_);
              local_41c = local_68;
              if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
                operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
              }
              if ((BasicBlock *)local_3f0._0_8_ != (BasicBlock *)(local_3f0 + 0x10)) {
                operator_delete((void *)local_3f0._0_8_,(ulong)(local_3f0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              if ((BasicBlock *)local_358._0_8_ != (BasicBlock *)(local_358 + 0x10)) {
                operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((BasicBlock *)local_2f8._M_w != (BasicBlock *)&local_2e8) {
                operator_delete((void *)local_2f8._M_w,(long)local_2e8 + 1);
              }
              if (local_2a8 != &local_298) {
                operator_delete(local_2a8,local_298._M_w + 1);
              }
              if (local_288 != (Instruction *)local_278) {
                operator_delete(local_288,local_278._0_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._32_8_ != &local_248) {
                operator_delete((void *)local_278._32_8_,local_248._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                                         local_3a8.field_2._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                operator_delete((void *)local_410._0_8_,
                                CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
              }
              if (local_388 != (undefined1  [8])local_378) {
                operator_delete((void *)local_388,
                                CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                         local_378[0]._M_local_buf[0]) + 1);
              }
            }
            else {
              local_330._M_w = _Var24._M_w;
              bVar25 = BasicBlock::structurally_dominates(pBVar17,pBVar18);
              if (bVar25) {
                if ((pBVar17 == pBVar18) && ((this->type_ & ~kContinue) == kSelection)) {
                  pIVar15 = ValidationState_t::FindDef(_,pBVar18->id_);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_410,_,pBVar17->id_);
                  ValidationState_t::getIdName_abi_cxx11_(&local_3a8,_,pBVar18->id_);
                  local_3d0._0_8_ = local_3d0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3d0,"does not strictly structurally dominate","");
                  ConstructErrorString
                            ((string *)local_388,this,(string *)local_410,&local_3a8,
                             (string *)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,(char *)local_388,
                             (long)local_380.super__Base_bitset<1UL>._M_w);
                  local_41c = local_68;
                  if (local_388 != (undefined1  [8])local_378) {
                    operator_delete((void *)local_388,
                                    CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                             local_378[0]._M_local_buf[0]) + 1);
                  }
                  _Var24._M_w = local_330._M_w;
                  plVar16 = local_338;
                  if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
                    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
                  }
                  bVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_3a8._M_dataplus._M_p == &local_3a8.field_2;
                  goto LAB_001aef1c;
                }
                local_2d0 = pBVar18;
                CVar10 = Construct::type(this);
                if ((CVar10 != kContinue) ||
                   (bVar25 = BasicBlock::structurally_postdominates(local_2d0,pBVar17),
                   pBVar18 = local_2d0, bVar25)) {
                  Construct::blocks((ConstructBlockSet *)local_388,this,local_328);
                  local_410._0_8_ = local_410 + 0x10;
                  local_410._8_8_ = 0;
                  local_410[0x10] = '\0';
                  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
                  local_3a8._M_string_length = 0;
                  local_3a8.field_2._M_local_buf[0] = '\0';
                  local_3d0._0_8_ = local_3d0 + 0x10;
                  local_3d0._8_8_ = (BasicBlock *)0x0;
                  local_3d0._16_8_ = local_3d0._16_8_ & 0xffffffffffffff00;
                  local_300 = this;
                  CVar10 = Construct::type(this);
                  ConstructNames_abi_cxx11_
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_238,(val *)(ulong)CVar10,type_00);
                  local_3f0._0_8_ = local_3d0;
                  local_3f0._8_8_ = &local_3a8;
                  local_3f0._16_8_ = local_410;
                  std::
                  _Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                  ::_M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                              *)local_3f0,
                             (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_p != local_1e8) {
                    operator_delete(local_1f8._M_p,local_1e8[0]._M_allocated_capacity + 1);
                  }
                  _Var24._M_w = local_330._M_w;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_p != &local_208) {
                    operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
                  }
                  if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)local_238._0_8_ !=
                      (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)(local_238 + 0x10)) {
                    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
                  }
                  uVar21 = local_378[0]._8_8_;
                  if ((_Rb_tree_node_base *)local_378[0]._8_8_ != (_Rb_tree_node_base *)&local_380)
                  {
                    do {
                      local_3b0 = pBVar17;
                      pBVar17 = (BasicBlock *)
                                (((BasicBlock *)uVar21)->predecessors_).
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      ppBVar23 = (pBVar17->successors_).
                                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      ppBVar5 = (pBVar17->successors_).
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      local_2d8 = (BasicBlock *)uVar21;
                      while( true ) {
                        bVar25 = ppBVar23 == ppBVar5;
                        if (bVar25) break;
                        local_358._0_8_ = *ppBVar23;
                        cVar20 = std::
                                 _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                         *)local_388,(key_type *)local_358);
                        bVar7 = true;
                        if ((cVar20._M_node == (_Base_ptr)&local_380) &&
                           (bVar8 = Construct::IsStructuredExit
                                              (local_300,_,(BasicBlock *)local_358._0_8_), !bVar8))
                        {
                          pIVar15 = ValidationState_t::FindDef(_,pBVar17->id_);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238,"block <ID> ",0xb);
                          ValidationState_t::getIdName_abi_cxx11_
                                    ((string *)local_3f0,_,pBVar17->id_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238,(char *)local_3f0._0_8_,local_3f0._8_8_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238," exits the ",0xb);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238,(char *)local_410._0_8_,local_410._8_8_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238," headed by <ID> ",0x10);
                          ValidationState_t::getIdName_abi_cxx11_(&local_320,_,local_3b0->id_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238,local_320._M_dataplus._M_p,
                                     local_320._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_238,", but not via a structured exit",0x1f);
                          local_41c = local_68;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_320._M_dataplus._M_p != &local_320.field_2) {
                            operator_delete(local_320._M_dataplus._M_p,
                                            local_320.field_2._M_allocated_capacity + 1);
                          }
                          if ((BasicBlock *)local_3f0._0_8_ != (BasicBlock *)(local_3f0 + 0x10)) {
                            operator_delete((void *)local_3f0._0_8_,(ulong)(local_3f0._16_8_ + 1));
                          }
                          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                          bVar7 = false;
                        }
                        if (!bVar7) {
                          cVar26 = '\x01';
                          goto LAB_001af2b9;
                        }
                        ppBVar23 = ppBVar23 + 1;
                      }
                      cVar26 = '\n';
LAB_001af2b9:
                      pBVar18 = local_2d8;
                      if (bVar25) {
                        if (pBVar17 == local_3b0) {
                          cVar26 = '\t';
                        }
                        else {
                          ppBVar23 = (pBVar17->predecessors_).
                                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          ppBVar5 = (pBVar17->predecessors_).
                                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          while( true ) {
                            bVar25 = ppBVar23 == ppBVar5;
                            if (bVar25) break;
                            local_3f0._0_8_ = *ppBVar23;
                            bVar7 = true;
                            if ((((BasicBlock *)local_3f0._0_8_)->structurally_reachable_ == true)
                               && (cVar20 = std::
                                            _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                            ::find((
                                                  _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                                  *)local_388,(key_type *)local_3f0),
                                  cVar20._M_node == (_Base_ptr)&local_380)) {
                              pIVar15 = ValidationState_t::FindDef(_,*(uint32_t *)local_3f0._0_8_);
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,
                                         pIVar15);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,"block <ID> ",0xb);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_238);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238," branches to the ",0x11);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,(char *)local_410._0_8_,
                                         local_410._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238," construct, but not to the ",0x1b);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,local_3a8._M_dataplus._M_p,
                                         local_3a8._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238," <ID> ",6);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_238);
                              local_41c = local_68;
                              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                              bVar7 = false;
                            }
                            if (!bVar7) {
                              cVar26 = '\x01';
                              goto LAB_001af422;
                            }
                            ppBVar23 = ppBVar23 + 1;
                          }
                          cVar26 = '\f';
LAB_001af422:
                          pBVar18 = local_2d8;
                          if (((bVar25) &&
                              (cVar26 = '\0',
                              ((pBVar17->type_).super__Base_bitset<1UL>._M_w & 6) != 0)) &&
                             ((pBVar17->terminator_[-1].inst_.opcode & 0xfffe) == 0xf6)) {
                            cVar26 = '\0';
                            uVar11 = Instruction::GetOperandAs<unsigned_int>
                                               (pBVar17->terminator_ + -1,0);
                            pVar27 = Function::GetBlock(local_328,uVar11);
                            local_2f8._M_w = (_WordT)pVar27.first;
                            if ((((BasicBlock *)local_2f8._M_w)->structurally_reachable_ == true) &&
                               (cVar20 = std::
                                         _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                         ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                                 *)local_388,(key_type *)&local_2f8),
                               cVar20._M_node == (_Base_ptr)&local_380)) {
                              pIVar15 = ValidationState_t::FindDef(_,pBVar17->id_);
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,
                                         pIVar15);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,"Header block ",0xd);
                              ValidationState_t::getIdName_abi_cxx11_
                                        ((string *)local_3f0,_,pBVar17->id_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,(char *)local_3f0._0_8_,
                                         local_3f0._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238," is contained in the ",0x15);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,(char *)local_410._0_8_,
                                         local_410._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238," construct headed by ",0x15);
                              ValidationState_t::getIdName_abi_cxx11_(&local_320,_,local_3b0->id_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,local_320._M_dataplus._M_p,
                                         local_320._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,", but its merge block ",0x16);
                              ValidationState_t::getIdName_abi_cxx11_((string *)local_358,_,uVar11);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,(char *)local_358._0_8_,
                                         local_358._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238," is not",7);
                              local_41c = local_68;
                              if ((BasicBlock *)local_358._0_8_ != (BasicBlock *)(local_358 + 0x10))
                              {
                                operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                                operator_delete(local_320._M_dataplus._M_p,
                                                local_320.field_2._M_allocated_capacity + 1);
                              }
                              if ((BasicBlock *)local_3f0._0_8_ != (BasicBlock *)(local_3f0 + 0x10))
                              {
                                operator_delete((void *)local_3f0._0_8_,
                                                (ulong)(local_3f0._16_8_ + 1));
                              }
                              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                              cVar26 = '\x01';
                            }
                          }
                        }
                      }
                      _Var24._M_w = local_330._M_w;
                      if ((cVar26 != '\t') && (pBVar17 = local_3b0, cVar26 != '\0'))
                      goto LAB_001afcc7;
                      uVar21 = std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar18);
                      pBVar17 = local_3b0;
                    } while ((BasicBlock *)uVar21 != (BasicBlock *)&local_380);
                  }
                  cVar26 = '\b';
LAB_001afcc7:
                  plVar16 = local_338;
                  if (cVar26 == '\b') {
                    CVar10 = Construct::type(local_300);
                    if (CVar10 == kLoop) {
                      uVar11 = Instruction::GetOperandAs<unsigned_int>(pBVar17->terminator_ + -1,1);
                      pIVar15 = ValidationState_t::FindDef(_,uVar11);
                      cVar26 = '\0';
                      bVar25 = true;
                      local_3b0 = pBVar17;
                      if (pBVar17->id_ != uVar11) {
                        ppBVar23 = ((pIVar15[1].block_)->predecessors_).
                                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        ppBVar5 = ((pIVar15[1].block_)->predecessors_).
                                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        if (ppBVar23 != ppBVar5) {
                          do {
                            local_2f8._M_w = (_WordT)*ppBVar23;
                            bVar7 = false;
                            for (ppVar22 = (((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                              *)local_278._24_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start; ppVar22 != *(pointer *)(local_278._24_8_ + 8);
                                ppVar22 = ppVar22 + 1) {
                              if ((uVar11 == (*ppVar22).second) &&
                                 (((BasicBlock *)local_2f8._M_w)->id_ == (*ppVar22).first)) {
                                bVar7 = true;
                              }
                            }
                            cVar20 = std::
                                     _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                     ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                             *)local_388,(key_type *)&local_2f8);
                            bVar8 = cVar20._M_node != (_Base_ptr)&local_380;
                            bVar25 = (bool)(bVar8 | bVar7);
                            if (!bVar8 && !bVar7) {
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,
                                         *(Instruction **)(local_2f8._M_w + 0x68));
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,"Block ",6);
                              ValidationState_t::getIdName_abi_cxx11_
                                        ((string *)local_3f0,_,*(uint32_t *)local_2f8._M_w);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,(char *)local_3f0._0_8_,
                                         local_3f0._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,
                                         " branches to the loop continue target ",0x26);
                              ValidationState_t::getIdName_abi_cxx11_(&local_320,_,uVar11);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,local_320._M_dataplus._M_p,
                                         local_320._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,
                                         ", but is not contained in the associated loop construct ",
                                         0x38);
                              ValidationState_t::getIdName_abi_cxx11_
                                        ((string *)local_358,_,local_3b0->id_);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_238,(char *)local_358._0_8_,
                                         local_358._8_8_);
                              local_41c = local_68;
                              if ((BasicBlock *)local_358._0_8_ != (BasicBlock *)(local_358 + 0x10))
                              {
                                operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                                operator_delete(local_320._M_dataplus._M_p,
                                                local_320.field_2._M_allocated_capacity + 1);
                              }
                              if ((BasicBlock *)local_3f0._0_8_ != (BasicBlock *)(local_3f0 + 0x10))
                              {
                                operator_delete((void *)local_3f0._0_8_,
                                                (ulong)(local_3f0._16_8_ + 1));
                              }
                              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
                            }
                            if (!bVar8 && !bVar7) {
                              cVar26 = '\x01';
                              goto LAB_001aff42;
                            }
                            ppBVar23 = ppBVar23 + 1;
                          } while (ppBVar23 != ppBVar5);
                          cVar26 = '\0';
                        }
                      }
LAB_001aff42:
                      plVar16 = local_338;
                      pBVar17 = local_3b0;
                      _Var24._M_w = local_330._M_w;
                      if (!bVar25) goto LAB_001affbc;
                    }
                    CVar10 = Construct::type(local_300);
                    cVar26 = '\0';
                    if ((CVar10 == kSelection) && ((pBVar17->terminator_->inst_).opcode == 0xfb)) {
                      sVar12 = StructuredSwitchChecks
                                         (_,local_328,pBVar17->terminator_,pBVar17,local_2d0);
                      cVar26 = sVar12 != SPV_SUCCESS;
                      if ((bool)cVar26) {
                        local_41c = sVar12;
                      }
                    }
                  }
LAB_001affbc:
                  if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
                    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                    operator_delete(local_3a8._M_dataplus._M_p,
                                    CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                                             local_3a8.field_2._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,
                                    CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
                  }
                  std::
                  _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ::_M_erase((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                              *)local_388,
                             (_Link_type)
                             CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                      local_378[0]._M_local_buf[0]));
                  goto LAB_001afb5f;
                }
                pIVar15 = ValidationState_t::FindDef(_,local_2d0->id_);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_410,_,pBVar17->id_);
                ValidationState_t::getIdName_abi_cxx11_(&local_3a8,_,pBVar18->id_);
                local_3d0._0_8_ = local_3d0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d0,"is not structurally post dominated by","");
                ConstructErrorString
                          ((string *)local_388,this,(string *)local_410,&local_3a8,
                           (string *)local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_238,(char *)local_388,
                           (long)local_380.super__Base_bitset<1UL>._M_w);
                local_41c = local_68;
                if (local_388 != (undefined1  [8])local_378) {
                  operator_delete((void *)local_388,
                                  CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                           local_378[0]._M_local_buf[0]) + 1);
                }
                plVar16 = local_338;
                if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
                  operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
                }
                _Var24._M_w = local_330._M_w;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) goto LAB_001aef2b;
              }
              else {
                local_300 = this;
                pIVar15 = ValidationState_t::FindDef(_,pBVar18->id_);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_238,_,SPV_ERROR_INVALID_CFG,pIVar15);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_410,_,pBVar17->id_);
                ValidationState_t::getIdName_abi_cxx11_(&local_3a8,_,pBVar18->id_);
                local_3d0._0_8_ = local_3d0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d0,"does not structurally dominate","");
                ConstructErrorString
                          ((string *)local_388,local_300,(string *)local_410,&local_3a8,
                           (string *)local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_238,(char *)local_388,
                           (long)local_380.super__Base_bitset<1UL>._M_w);
                local_41c = local_68;
                if (local_388 != (undefined1  [8])local_378) {
                  operator_delete((void *)local_388,
                                  CONCAT71(local_378[0]._M_allocated_capacity._1_7_,
                                           local_378[0]._M_local_buf[0]) + 1);
                }
                _Var24._M_w = local_330._M_w;
                if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
                  operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
                }
                bVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_3a8._M_dataplus._M_p == &local_3a8.field_2;
                plVar16 = local_338;
LAB_001aef1c:
                if (!bVar25) {
LAB_001aef2b:
                  operator_delete(local_3a8._M_dataplus._M_p,
                                  CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                                           local_3a8.field_2._M_local_buf[0]) + 1);
                }
              }
              if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                operator_delete((void *)local_410._0_8_,
                                CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_238);
            }
            cVar26 = '\x01';
          }
          else {
            cVar26 = '\a';
          }
LAB_001afb5f:
          if ((cVar26 != '\a') && (cVar26 != '\0')) goto LAB_001b0038;
          _Var24._M_w = (_WordT)(((list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
                                   *)_Var24._M_w)->
                                super__List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
                                )._M_impl._M_node.super__List_node_base._M_next;
          plVar6 = local_338;
        } while ((list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *)
                 _Var24._M_w != plVar16);
        cVar26 = '\x06';
LAB_001b0038:
        bVar25 = cVar26 == '\x06';
      }
      if (bVar25) {
        local_41c = ValidateStructuredSelections
                              (_,(vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                  *)local_278._16_8_);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_41c;
}

Assistant:

spv_result_t StructuredControlFlowChecks(
    ValidationState_t& _, Function* function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges,
    const std::vector<const BasicBlock*>& postorder) {
  /// Check all backedges target only loop headers and have exactly one
  /// back-edge branching to it

  // Map a loop header to blocks with back-edges to the loop header.
  std::map<uint32_t, std::unordered_set<uint32_t>> loop_latch_blocks;
  for (auto back_edge : back_edges) {
    uint32_t back_edge_block;
    uint32_t header_block;
    std::tie(back_edge_block, header_block) = back_edge;
    if (!function->IsBlockType(header_block, kBlockTypeLoop)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(back_edge_block))
             << "Back-edges (" << _.getIdName(back_edge_block) << " -> "
             << _.getIdName(header_block)
             << ") can only be formed between a block and a loop header.";
    }
    loop_latch_blocks[header_block].insert(back_edge_block);
  }

  // Check the loop headers have exactly one back-edge branching to it
  for (BasicBlock* loop_header : function->ordered_blocks()) {
    if (!loop_header->structurally_reachable()) continue;
    if (!loop_header->is_type(kBlockTypeLoop)) continue;
    auto loop_header_id = loop_header->id();
    auto num_latch_blocks = loop_latch_blocks[loop_header_id].size();
    if (num_latch_blocks != 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(loop_header_id))
             << "Loop header " << _.getIdName(loop_header_id)
             << " is targeted by " << num_latch_blocks
             << " back-edge blocks but the standard requires exactly one";
    }
  }

  // Check construct rules
  for (const Construct& construct : function->constructs()) {
    auto header = construct.entry_block();
    if (!header->structurally_reachable()) continue;
    auto merge = construct.exit_block();

    if (!merge) {
      std::string construct_name, header_name, exit_name;
      std::tie(construct_name, header_name, exit_name) =
          ConstructNames(construct.type());
      return _.diag(SPV_ERROR_INTERNAL, _.FindDef(header->id()))
             << "Construct " + construct_name + " with " + header_name + " " +
                    _.getIdName(header->id()) + " does not have a " +
                    exit_name + ". This may be a bug in the validator.";
    }

    // If the header is reachable, the merge is guaranteed to be structurally
    // reachable.
    if (!header->structurally_dominates(*merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not structurally dominate");
    }

    // If it's really a merge block for a selection or loop, then it must be
    // *strictly* structrually dominated by the header.
    if (construct.ExitBlockIsMergeBlock() && (header == merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not strictly structurally dominate");
    }

    // Check post-dominance for continue constructs.  But dominance and
    // post-dominance only make sense when the construct is reachable.
    if (construct.type() == ConstructType::kContinue) {
      if (!merge->structurally_postdominates(*header)) {
        return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
               << ConstructErrorString(construct, _.getIdName(header->id()),
                                       _.getIdName(merge->id()),
                                       "is not structurally post dominated by");
      }
    }

    Construct::ConstructBlockSet construct_blocks = construct.blocks(function);
    std::string construct_name, header_name, exit_name;
    std::tie(construct_name, header_name, exit_name) =
        ConstructNames(construct.type());
    for (auto block : construct_blocks) {
      // Check that all exits from the construct are via structured exits.
      for (auto succ : *block->successors()) {
        if (!construct_blocks.count(succ) &&
            !construct.IsStructuredExit(_, succ)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                 << "block <ID> " << _.getIdName(block->id()) << " exits the "
                 << construct_name << " headed by <ID> "
                 << _.getIdName(header->id())
                 << ", but not via a structured exit";
        }
      }
      if (block == header) continue;
      // Check that for all non-header blocks, all predecessors are within this
      // construct.
      for (auto pred : *block->predecessors()) {
        if (pred->structurally_reachable() && !construct_blocks.count(pred)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pred->id()))
                 << "block <ID> " << pred->id() << " branches to the "
                 << construct_name << " construct, but not to the "
                 << header_name << " <ID> " << header->id();
        }
      }

      if (block->is_type(BlockType::kBlockTypeSelection) ||
          block->is_type(BlockType::kBlockTypeLoop)) {
        size_t index = (block->terminator() - &_.ordered_instructions()[0]) - 1;
        const auto& merge_inst = _.ordered_instructions()[index];
        if (merge_inst.opcode() == spv::Op::OpSelectionMerge ||
            merge_inst.opcode() == spv::Op::OpLoopMerge) {
          uint32_t merge_id = merge_inst.GetOperandAs<uint32_t>(0);
          auto merge_block = function->GetBlock(merge_id).first;
          if (merge_block->structurally_reachable() &&
              !construct_blocks.count(merge_block)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                   << "Header block " << _.getIdName(block->id())
                   << " is contained in the " << construct_name
                   << " construct headed by " << _.getIdName(header->id())
                   << ", but its merge block " << _.getIdName(merge_id)
                   << " is not";
          }
        }
      }
    }

    if (construct.type() == ConstructType::kLoop) {
      // If the continue target differs from the loop header, then check that
      // all edges into the continue construct come from within the loop.
      const auto index = header->terminator() - &_.ordered_instructions()[0];
      const auto& merge_inst = _.ordered_instructions()[index - 1];
      const auto continue_id = merge_inst.GetOperandAs<uint32_t>(1);
      const auto* continue_inst = _.FindDef(continue_id);
      // OpLabel instructions aren't stored as part of the basic block for
      // legacy reaasons. Grab the next instruction and use it's block pointer
      // instead.
      const auto next_index =
          (continue_inst - &_.ordered_instructions()[0]) + 1;
      const auto& next_inst = _.ordered_instructions()[next_index];
      const auto* continue_target = next_inst.block();
      if (header->id() != continue_id) {
        for (auto pred : *continue_target->predecessors()) {
          // Ignore back-edges from within the continue construct.
          bool is_back_edge = false;
          for (auto back_edge : back_edges) {
            uint32_t back_edge_block;
            uint32_t header_block;
            std::tie(back_edge_block, header_block) = back_edge;
            if (header_block == continue_id && back_edge_block == pred->id())
              is_back_edge = true;
          }
          if (!construct_blocks.count(pred) && !is_back_edge) {
            return _.diag(SPV_ERROR_INVALID_CFG, pred->terminator())
                   << "Block " << _.getIdName(pred->id())
                   << " branches to the loop continue target "
                   << _.getIdName(continue_id)
                   << ", but is not contained in the associated loop construct "
                   << _.getIdName(header->id());
          }
        }
      }
    }

    // Checks rules for case constructs.
    if (construct.type() == ConstructType::kSelection &&
        header->terminator()->opcode() == spv::Op::OpSwitch) {
      const auto terminator = header->terminator();
      if (auto error =
              StructuredSwitchChecks(_, function, terminator, header, merge)) {
        return error;
      }
    }
  }

  if (auto error = ValidateStructuredSelections(_, postorder)) {
    return error;
  }

  return SPV_SUCCESS;
}